

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O0

void __thiscall
CDirectivePosition::CDirectivePosition(CDirectivePosition *this,Expression *expression,Type type)

{
  Type type_local;
  Expression *expression_local;
  CDirectivePosition *this_local;
  
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__CDirectivePosition_002aa078;
  Expression::Expression(&this->expression,expression);
  this->type = type;
  Global.Section = Global.Section + 1;
  CAssemblerCommand::updateSection(&this->super_CAssemblerCommand,Global.Section);
  return;
}

Assistant:

CDirectivePosition::CDirectivePosition(Expression expression, Type type)
	: expression(expression), type(type)
{
	updateSection(++Global.Section);
}